

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElementTable.h
# Opt level: O1

void __thiscall
psy::TextElementTable<psy::C::IntegerConstant>::reset
          (TextElementTable<psy::C::IntegerConstant> *this)

{
  int iVar1;
  IntegerConstant **ppIVar2;
  Lexeme *this_00;
  long lVar3;
  
  ppIVar2 = this->elements_;
  if (ppIVar2 != (IntegerConstant **)0x0) {
    iVar1 = this->count_;
    if (ppIVar2 != ppIVar2 + (long)iVar1 + 1) {
      lVar3 = 0;
      do {
        this_00 = *(Lexeme **)((long)ppIVar2 + lVar3);
        if (this_00 != (Lexeme *)0x0) {
          C::Lexeme::~Lexeme(this_00);
          operator_delete(this_00,0x30);
        }
        lVar3 = lVar3 + 8;
      } while ((long)iVar1 * 8 + 8 != lVar3);
    }
    free(this->elements_);
  }
  if (this->buckets_ != (IntegerConstant **)0x0) {
    free(this->buckets_);
  }
  this->elements_ = (IntegerConstant **)0x0;
  this->buckets_ = (IntegerConstant **)0x0;
  this->count_ = -1;
  this->allocated_ = 0;
  this->bucketCount_ = 0;
  return;
}

Assistant:

void reset()
    {
        if (elements_) {
            ElemT** last = elements_ + count_ + 1;
            for (ElemT** it = elements_; it != last; ++it)
                delete *it;
            std::free(elements_);
        }

        if (buckets_)
            std::free(buckets_);

        elements_ = 0;
        buckets_ = 0;
        allocated_ = 0;
        count_ = -1;
        bucketCount_ = 0;
    }